

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::peer_connection::ignore_unchoke_slots(peer_connection *this)

{
  session_interface *psVar1;
  int iVar2;
  bool bVar3;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((this->super_peer_connection_hot_members).field_0x2c == '\0') {
    return true;
  }
  psVar1 = (this->super_peer_connection_hot_members).m_ses;
  iVar2 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                    (psVar1,&(this->super_peer_connection_hot_members).field_0x2c);
  if ((char)iVar2 != '\0') {
    return true;
  }
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&(this->super_peer_connection_hot_members).m_torrent);
  if (local_20._M_ptr != (element_type *)0x0) {
    psVar1 = (this->super_peer_connection_hot_members).m_ses;
    iVar2 = (*(psVar1->super_session_logger)._vptr_session_logger[0x33])
                      (psVar1,&(local_20._M_ptr)->super_peer_class_set);
    bVar3 = true;
    if ((char)iVar2 != '\0') goto LAB_002210e7;
  }
  bVar3 = false;
LAB_002210e7:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return bVar3;
}

Assistant:

bool peer_connection::ignore_unchoke_slots() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (num_classes() == 0) return true;

		if (m_ses.ignore_unchoke_slots_set(*this)) return true;
		auto t = m_torrent.lock();
		if (t && m_ses.ignore_unchoke_slots_set(*t)) return true;
		return false;
	}